

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O3

void PrintHierarchy(aiNode *node,string *indent,bool verbose,bool last,bool first)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  ostream *poVar5;
  size_t sVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  char **ppcVar7;
  undefined7 in_register_00000081;
  ulong uVar8;
  char cVar9;
  ulong uVar10;
  string nextIndent;
  string branchchar;
  string local_c0;
  undefined8 local_a0;
  float local_98;
  long local_90 [2];
  aiVector3t<float> local_80;
  aiVector3t<float> local_70;
  undefined4 local_64;
  int local_60;
  undefined4 local_5c;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  string *local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = '\0';
  local_60 = (int)CONCAT71(in_register_00000081,first);
  local_5c = (undefined4)CONCAT71(in_register_00000009,last);
  if (local_60 == 0) {
    ppcVar7 = &TREE_BRANCH;
    if (last) {
      ppcVar7 = &TREE_STOP;
    }
    pcVar2 = *ppcVar7;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)pcVar2);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,0x6b7314);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_58,local_50);
  pcVar2 = (node->mName).data;
  sVar6 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar2,sVar6);
  if (node->mNumMeshes != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (mesh ",7);
    local_64 = (undefined4)CONCAT71(in_register_00000011,verbose);
    local_38 = indent;
    if (node->mNumMeshes != 0) {
      uVar8 = 0;
      bVar4 = false;
      do {
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        }
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        uVar8 = uVar8 + 1;
        bVar4 = true;
      } while (uVar8 < node->mNumMeshes);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    verbose = SUB41(local_64,0);
    indent = local_38;
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  paVar1 = &local_c0.field_2;
  cVar9 = (char)local_5c;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  if (verbose != false) {
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    if (cVar9 == '\0') {
      std::__cxx11::string::append((char *)&local_c0);
    }
    else {
      std::__cxx11::string::append((char *)&local_c0);
    }
    if (node->mNumChildren == 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    else {
      std::__cxx11::string::append((char *)&local_c0);
    }
    local_a0 = (long *)0x0;
    local_98 = 0.0;
    local_70.x = 0.0;
    local_70.y = 0.0;
    local_70.z = 0.0;
    local_80.x = 0.0;
    local_80.y = 0.0;
    local_80.z = 0.0;
    aiMatrix4x4t<float>::Decompose
              (&node->mTransformation,(aiVector3t<float> *)&local_a0,&local_70,&local_80);
    if (((float)local_a0 != 1.0) || (NAN((float)local_a0))) {
LAB_002e8c84:
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      printf("  S:[%f %f %f]\n",(double)(float)local_a0,(double)local_a0._4_4_,(double)local_98);
    }
    else if ((local_a0._4_4_ != 1.0) ||
            (((NAN(local_a0._4_4_) || (local_98 != 1.0)) || (NAN(local_98))))) goto LAB_002e8c84;
    if ((local_70.x != 0.0) || (NAN(local_70.x))) {
LAB_002e8cf9:
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      printf("  R:[%f %f %f]\n",(double)local_70.x,(double)local_70.y,(double)local_70.z);
    }
    else if (((local_70.y != 0.0) || ((NAN(local_70.y) || (local_70.z != 0.0)))) ||
            (NAN(local_70.z))) goto LAB_002e8cf9;
    if ((local_80.x != 0.0) || (NAN(local_80.x))) {
LAB_002e8d74:
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      printf("  T:[%f %f %f]\n",(double)local_80.x,(double)local_80.y,(double)local_80.z);
    }
    else if ((local_80.y != 0.0) ||
            (((NAN(local_80.y) || (local_80.z != 0.0)) || (NAN(local_80.z))))) goto LAB_002e8d74;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
  }
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  if ((char)local_60 == '\0') {
    if (cVar9 == '\0') {
      pcVar3 = (indent->_M_dataplus)._M_p;
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar3,pcVar3 + indent->_M_string_length);
      std::__cxx11::string::append((char *)&local_a0);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
      if (local_a0 == local_90) goto LAB_002e8e60;
    }
    else {
      pcVar3 = (indent->_M_dataplus)._M_p;
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar3,pcVar3 + indent->_M_string_length);
      std::__cxx11::string::append((char *)&local_a0);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
      if (local_a0 == local_90) goto LAB_002e8e60;
    }
    operator_delete(local_a0,local_90[0] + 1);
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_c0);
  }
LAB_002e8e60:
  uVar8 = (ulong)node->mNumChildren;
  if (node->mNumChildren != 0) {
    uVar10 = 0;
    do {
      PrintHierarchy(node->mChildren[uVar10],&local_c0,verbose,uVar10 == (int)uVar8 - 1,false);
      uVar10 = uVar10 + 1;
      uVar8 = (ulong)node->mNumChildren;
    } while (uVar10 < uVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void PrintHierarchy(
	const aiNode* node,
	const std::string &indent,
	bool verbose,
	bool last = false,
	bool first = true
){
	// tree visualization
	std::string branchchar;
	if (first) { branchchar = ""; }
	else if (last) { branchchar = TREE_STOP; } // "'-"
	else { branchchar = TREE_BRANCH; } // "|-"

	// print the indent and the branch character and the name
	std::cout << indent << branchchar << node->mName.C_Str();

	// if there are meshes attached, indicate this
	if (node->mNumMeshes) {
		std::cout << " (mesh ";
		bool sep = false;
		for (size_t i=0; i < node->mNumMeshes; ++i) {
			unsigned int mesh_index = node->mMeshes[i];
			if (sep) { std::cout << ", "; }
			std::cout << mesh_index;
			sep = true;
		}
		std::cout << ")";
	}

	// finish the line
	std::cout << std::endl;

	// in verbose mode, print the transform data as well
	if (verbose) {
		// indent to use
		std::string indentadd;
		if (last) { indentadd += "  "; }
		else { indentadd += TREE_CONTINUE; } // "| "..
		if (node->mNumChildren == 0) { indentadd += "  "; }
		else { indentadd += TREE_CONTINUE; } // .."| "
		aiVector3D s, r, t;
		node->mTransformation.Decompose(s, r, t);
		if (s.x != 1.0 || s.y != 1.0 || s.z != 1.0) {
			std::cout << indent << indentadd;
			printf("  S:[%f %f %f]\n", s.x, s.y, s.z);
		}
		if (r.x || r.y || r.z) {
			std::cout << indent << indentadd;
			printf("  R:[%f %f %f]\n", r.x, r.y, r.z);
		}
		if (t.x || t.y || t.z) {
			std::cout << indent << indentadd;
			printf("  T:[%f %f %f]\n", t.x, t.y, t.z);
		}
	}

	// and recurse
	std::string nextIndent;
	if (first) { nextIndent = indent; }
	else if (last) { nextIndent = indent + "  "; }
	else { nextIndent = indent + TREE_CONTINUE; } // "| "
	for (size_t i = 0; i < node->mNumChildren; ++i) {
		bool lastone = (i == node->mNumChildren - 1);
		PrintHierarchy(
			node->mChildren[i],
			nextIndent,
			verbose,
			lastone,
			false
		);
	}
}